

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context_uninit_backend_apis__nix(ma_context *pContext)

{
  ma_context *pContext_local;
  
  return 0;
}

Assistant:

static ma_result ma_context_uninit_backend_apis__nix(ma_context* pContext)
{
#if defined(MA_USE_RUNTIME_LINKING_FOR_PTHREAD) && !defined(MA_NO_RUNTIME_LINKING)
    ma_dlclose(pContext, pContext->posix.pthreadSO);
#else
    (void)pContext;
#endif

    return MA_SUCCESS;
}